

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void opj_t1_dec_sigpass_step_raw
               (opj_t1_t *t1,opj_flag_t *flagsp,OPJ_INT32 *datap,OPJ_INT32 oneplushalf,
               OPJ_UINT32 vsc,OPJ_UINT32 ci)

{
  char cVar1;
  OPJ_UINT32 OVar2;
  int local_40;
  OPJ_UINT32 flags;
  opj_mqc_t *mqc;
  OPJ_UINT32 v;
  OPJ_UINT32 ci_local;
  OPJ_UINT32 vsc_local;
  OPJ_INT32 oneplushalf_local;
  OPJ_INT32 *datap_local;
  opj_flag_t *flagsp_local;
  opj_t1_t *t1_local;
  
  cVar1 = (char)ci;
  if (((*flagsp & 0x200010 << (cVar1 * '\x03' & 0x1fU)) == 0) &&
     ((*flagsp & 0x1ef << (cVar1 * '\x03' & 0x1fU)) != 0)) {
    OVar2 = opj_mqc_raw_decode(&t1->mqc);
    if (OVar2 != 0) {
      OVar2 = opj_mqc_raw_decode(&t1->mqc);
      local_40 = oneplushalf;
      if (OVar2 != 0) {
        local_40 = -oneplushalf;
      }
      *datap = local_40;
      opj_t1_update_flags(flagsp,ci,OVar2,t1->w + 2,vsc);
    }
    *flagsp = 0x200000 << (cVar1 * '\x03' & 0x1fU) | *flagsp;
  }
  return;
}

Assistant:

static INLINE void opj_t1_dec_sigpass_step_raw(
    opj_t1_t *t1,
    opj_flag_t *flagsp,
    OPJ_INT32 *datap,
    OPJ_INT32 oneplushalf,
    OPJ_UINT32 vsc,
    OPJ_UINT32 ci)
{
    OPJ_UINT32 v;
    opj_mqc_t *mqc = &(t1->mqc);       /* RAW component */

    OPJ_UINT32 const flags = *flagsp;

    if ((flags & ((T1_SIGMA_THIS | T1_PI_THIS) << (ci * 3U))) == 0U &&
            (flags & (T1_SIGMA_NEIGHBOURS << (ci * 3U))) != 0U) {
        if (opj_mqc_raw_decode(mqc)) {
            v = opj_mqc_raw_decode(mqc);
            *datap = v ? -oneplushalf : oneplushalf;
            opj_t1_update_flags(flagsp, ci, v, t1->w + 2, vsc);
        }
        *flagsp |= T1_PI_THIS << (ci * 3U);
    }
}